

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

void __thiscall
ddd::DictionarySGL<false,_false>::enumerate
          (DictionarySGL<false,_false> *this,vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_00000028;
  string *in_stack_00000030;
  uint32_t in_stack_0000003c;
  DaTrie<false,_false,_false> *in_stack_00000040;
  string local_30 [8];
  size_type in_stack_ffffffffffffffd8;
  vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *in_stack_ffffffffffffffe0;
  
  std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::clear
            ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)0x14e422);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                *)0x14e430);
  bVar1 = DaTrie<false,_false,_false>::is_empty((DaTrie<false,_false,_false> *)0x14e438);
  if (!bVar1) {
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::reserve
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::
    unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
    ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                  *)0x14e461);
    std::__cxx11::string::string(local_30);
    DaTrie<false,_false,_false>::enumerate
              (in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_00000028);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void enumerate(std::vector<KvPair>& kvs) const {
    kvs.clear();
    if (trie_->is_empty()) {
      return;
    }
    kvs.reserve(num_keys_);
    trie_->enumerate(ROOT_POS, std::string(), kvs);
  }